

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_grasshopper_cipher.c
# Opt level: O3

int gost_grasshopper_cipher_init_mgm(EVP_CIPHER_CTX *ctx,uchar *key,uchar *iv,int enc)

{
  int iVar1;
  void *key_00;
  
  key_00 = (void *)EVP_CIPHER_CTX_get_cipher_data();
  if (key == (uchar *)0x0 && iv == (uchar *)0x0) {
    return 1;
  }
  if (key == (uchar *)0x0) {
    if (*(int *)((long)key_00 + 0x1088) == 0) {
      memcpy(*(void **)((long)key_00 + 0x1158),iv,(long)*(int *)((long)key_00 + 0x1160));
    }
    else {
      iVar1 = gost_mgm128_setiv((mgm128_context *)((long)key_00 + 0x1090),iv,
                                (long)*(int *)((long)key_00 + 0x1160));
      if (iVar1 != 1) {
        return 0;
      }
    }
    *(undefined4 *)((long)key_00 + 0x108c) = 1;
  }
  else {
    iVar1 = EVP_CIPHER_CTX_get_iv_length(ctx);
    *(undefined8 *)((long)key_00 + 0x28) = *(undefined8 *)key;
    *(undefined8 *)((long)key_00 + 0x30) = *(undefined8 *)(key + 8);
    *(undefined8 *)((long)key_00 + 0x38) = *(undefined8 *)(key + 0x10);
    *(undefined8 *)((long)key_00 + 0x40) = *(undefined8 *)(key + 0x18);
    grasshopper_set_encrypt_key
              ((grasshopper_round_keys_t *)((long)key_00 + 0x48),
               (grasshopper_key_t *)((long)key_00 + 0x28));
    grasshopper_set_decrypt_key
              ((grasshopper_round_keys_t *)((long)key_00 + 0xe8),
               (grasshopper_key_t *)((long)key_00 + 0x28));
    gost_mgm128_init((mgm128_context *)((long)key_00 + 0x1090),key_00,gost_grasshopper_encrypt_wrap,
                     gf128_mul_uint64,iVar1);
    if ((iv != (uchar *)0x0) ||
       ((*(int *)((long)key_00 + 0x108c) != 0 &&
        (iv = *(uchar **)((long)key_00 + 0x1158), iv != (uchar *)0x0)))) {
      iVar1 = gost_mgm128_setiv((mgm128_context *)((long)key_00 + 0x1090),iv,
                                (long)*(int *)((long)key_00 + 0x1160));
      if (iVar1 != 1) {
        return 0;
      }
      *(undefined4 *)((long)key_00 + 0x108c) = 1;
    }
    *(undefined4 *)((long)key_00 + 0x1088) = 1;
  }
  return 1;
}

Assistant:

static GRASSHOPPER_INLINE int
gost_grasshopper_cipher_init_mgm(EVP_CIPHER_CTX *ctx, const unsigned char *key,
                                 const unsigned char *iv, int enc)
{
    gost_mgm_ctx *mctx =
        (gost_mgm_ctx *)EVP_CIPHER_CTX_get_cipher_data(ctx);
    int bl;

    if (!iv && !key)
        return 1;
    if (key) {
        bl = EVP_CIPHER_CTX_iv_length(ctx);
        gost_grasshopper_cipher_key(&mctx->ks.gh_ks, key);
        gost_mgm128_init(&mctx->mgm, &mctx->ks,
                         (block128_f) gost_grasshopper_encrypt_wrap, gf128_mul_uint64, bl);

        /*
         * If we have an iv can set it directly, otherwise use saved IV.
         */
        if (iv == NULL && mctx->iv_set)
            iv = mctx->iv;
        if (iv) {
            if (gost_mgm128_setiv(&mctx->mgm, iv, mctx->ivlen) != 1)
                return 0;
            mctx->iv_set = 1;
        }
        mctx->key_set = 1;
    } else {
        /* If key set use IV, otherwise copy */
        if (mctx->key_set) {
            if (gost_mgm128_setiv(&mctx->mgm, iv, mctx->ivlen) != 1)
                return 0;
        }
        else
            memcpy(mctx->iv, iv, mctx->ivlen);
        mctx->iv_set = 1;
    }
    return 1;
}